

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O2

uint __thiscall
glcts::TessellationShaderInvarianceRule7Test::getAmountOfIterations
          (TessellationShaderInvarianceRule7Test *this)

{
  pointer p_Var1;
  pointer p_Var2;
  pointer p_Var3;
  pointer p_Var4;
  
  p_Var3 = (this->m_test_quads_iterations).
           super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (this->m_test_quads_iterations).
           super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var1 != p_Var3) {
    p_Var4 = (this->m_test_triangles_iterations).
             super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var2 = (this->m_test_triangles_iterations).
             super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var2 != p_Var4) goto LAB_00d0a1fe;
  }
  initTestIterations(this);
  p_Var1 = (this->m_test_quads_iterations).
           super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var3 = (this->m_test_quads_iterations).
           super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var4 = (this->m_test_triangles_iterations).
           super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (this->m_test_triangles_iterations).
           super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_00d0a1fe:
  return (int)(((long)p_Var2 - (long)p_Var4) / 0x2c) + (int)(((long)p_Var1 - (long)p_Var3) / 0x2c);
}

Assistant:

unsigned int TessellationShaderInvarianceRule7Test::getAmountOfIterations()
{
	if (m_test_quads_iterations.size() == 0 || m_test_triangles_iterations.size() == 0)
	{
		initTestIterations();
	}

	return (unsigned int)(m_test_quads_iterations.size() + m_test_triangles_iterations.size());
}